

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O3

bufptr __thiscall cornerstone::cluster_config::serialize(cluster_config *this)

{
  ulong *puVar1;
  undefined8 uVar2;
  size_t sVar3;
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  ulong *in_RSI;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *item;
  pointer puVar4;
  size_t size;
  bufptr bVar5;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  srv_buffs;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  ulong *local_38;
  
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  size = 0x14;
  local_38 = in_RSI;
  for (puVar1 = (ulong *)in_RSI[2]; puVar1 != in_RSI + 2; puVar1 = (ulong *)*puVar1) {
    srv_config::serialize((srv_config *)local_68);
    sVar3 = buffer::size((buffer *)local_68._8_8_);
    std::
    vector<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,std::allocator<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>>
    ::emplace_back<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>
              ((vector<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,std::allocator<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>>
                *)local_58,
               (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)local_68);
    if ((buffer *)local_68._8_8_ != (buffer *)0x0) {
      (*(code *)local_68._0_8_)((buffer *)local_68._8_8_);
    }
    size = size + sVar3;
  }
  buffer::alloc((buffer *)this,size);
  buffer::put((buffer *)this->prev_log_idx_,*local_38);
  buffer::put((buffer *)this->prev_log_idx_,local_38[1]);
  buffer::put((buffer *)this->prev_log_idx_,(int32)local_38[4]);
  uVar2 = local_58._8_8_;
  for (puVar4 = (pointer)local_58._0_8_; puVar4 != (pointer)uVar2; puVar4 = puVar4 + 1) {
    buffer::put((buffer *)this->prev_log_idx_,
                (puVar4->_M_t).
                super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
                super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
  }
  buffer::pos((buffer *)this->prev_log_idx_,0);
  std::
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ::~vector((vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
             *)local_58);
  bVar5._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar5._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this;
  return (bufptr)bVar5._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr cluster_config::serialize()
{
    size_t sz = 2 * sz_ulong + sz_int;
    std::vector<bufptr> srv_buffs;
    for (cluster_config::const_srv_itor it = servers_.begin(); it != servers_.end(); ++it)
    {
        bufptr buf = (*it)->serialize();
        sz += buf->size();
        srv_buffs.emplace_back(std::move(buf));
    }

    bufptr result = buffer::alloc(sz);
    result->put(log_idx_);
    result->put(prev_log_idx_);
    result->put((int32)servers_.size());
    for (auto& item : srv_buffs)
    {
        result->put(*item);
    }

    result->pos(0);
    return result;
}